

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall
QWizardField::QWizardField
          (QWizardField *this,QWizardPage *page,QString *spec,QObject *object,char *property,
          char *changedSignal)

{
  Data *pDVar1;
  char cVar2;
  
  this->page = page;
  pDVar1 = (spec->d).d;
  (this->name).d.d = pDVar1;
  (this->name).d.ptr = (spec->d).ptr;
  (this->name).d.size = (spec->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this->mandatory = false;
  this->object = object;
  QByteArray::QByteArray(&this->property,property,-1);
  QByteArray::QByteArray(&this->changedSignal,changedSignal,-1);
  (this->initialValue).d.data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(this->initialValue).d.data + 8) = 0;
  *(undefined8 *)((long)&(this->initialValue).d.data + 0x10) = 0;
  *(undefined8 *)&(this->initialValue).d.field_0x18 = 2;
  cVar2 = QString::endsWith((QChar)(char16_t)&this->name,0x2a);
  if (cVar2 != '\0') {
    QString::chop((longlong)&this->name);
    this->mandatory = true;
  }
  return;
}

Assistant:

QWizardField::QWizardField(QWizardPage *page, const QString &spec, QObject *object,
                           const char *property, const char *changedSignal)
    : page(page), name(spec), mandatory(false), object(object), property(property),
      changedSignal(changedSignal)
{
    if (name.endsWith(u'*')) {
        name.chop(1);
        mandatory = true;
    }
}